

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadExternalKind
          (BinaryReader *this,ExternalKind *out_value,char *desc)

{
  Result RVar1;
  Enum EVar2;
  uint8_t value;
  byte local_19;
  
  local_19 = 0;
  RVar1 = ReadU8(this,&local_19,"export kind");
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    if (local_19 < (Event|Table)) {
      *out_value = (uint)local_19;
      EVar2 = Ok;
    }
    else {
      PrintError(this,"invalid export external kind: %d");
    }
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReader::ReadExternalKind(ExternalKind* out_value,
                                      const char* desc) {
  uint8_t value = 0;
  CHECK_RESULT(ReadU8(&value, desc));
  ERROR_UNLESS(value < kExternalKindCount, "invalid export external kind: %d",
               value);
  *out_value = static_cast<ExternalKind>(value);
  return Result::Ok;
}